

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_dict_inflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  int iVar1;
  Byte *local_a0;
  z_stream d_stream;
  int err;
  uLong uncomprLen_local;
  Byte *uncompr_local;
  uLong comprLen_local;
  Byte *compr_local;
  
  strcpy((char *)uncompr,"garbage");
  d_stream.state = (internal_state *)zalloc;
  d_stream.zalloc = (alloc_func)zfree;
  d_stream.zfree = (free_func)0x0;
  d_stream.next_in._0_4_ = (undefined4)comprLen;
  local_a0 = compr;
  d_stream.reserved._4_4_ = inflateInit_(&local_a0,"1.2.8",0x70);
  if (d_stream.reserved._4_4_ != 0) {
    fprintf(_stderr,"%s error: %d\n","inflateInit",(ulong)d_stream.reserved._4_4_);
    exit(1);
  }
  d_stream.next_out._0_4_ = (undefined4)uncomprLen;
  d_stream.reserved._4_4_ = 0;
  d_stream.total_in = (uLong)uncompr;
  do {
    d_stream.reserved._4_4_ = inflate(&local_a0,0);
    if (d_stream.reserved._4_4_ == 1) {
      d_stream.reserved._4_4_ = inflateEnd(&local_a0);
      if (d_stream.reserved._4_4_ != 0) {
        fprintf(_stderr,"%s error: %d\n","inflateEnd",(ulong)d_stream.reserved._4_4_);
        exit(1);
      }
      iVar1 = strcmp((char *)uncompr,hello);
      if (iVar1 == 0) {
        printf("inflate with dictionary: %s\n",uncompr);
        return;
      }
      fprintf(_stderr,"bad inflate with dict\n");
      exit(1);
    }
    if (d_stream.reserved._4_4_ == 2) {
      if (d_stream._88_8_ != dictId) {
        fprintf(_stderr,"unexpected dictionary");
        exit(1);
      }
      d_stream.reserved._4_4_ = inflateSetDictionary(&local_a0,"hello",6);
    }
  } while (d_stream.reserved._4_4_ == 0);
  fprintf(_stderr,"%s error: %d\n","inflate with dict",(ulong)d_stream.reserved._4_4_);
  exit(1);
}

Assistant:

void test_dict_inflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = (uInt)comprLen;

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    d_stream.next_out = uncompr;
    d_stream.avail_out = (uInt)uncomprLen;

    for (;;) {
        err = inflate(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        if (err == Z_NEED_DICT) {
            if (d_stream.adler != dictId) {
                fprintf(stderr, "unexpected dictionary");
                exit(1);
            }
            err = inflateSetDictionary(&d_stream, (const Bytef*)dictionary,
                                       (int)sizeof(dictionary));
        }
        CHECK_ERR(err, "inflate with dict");
    }

    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad inflate with dict\n");
        exit(1);
    } else {
        printf("inflate with dictionary: %s\n", (char *)uncompr);
    }
}